

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void dfst(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int nc;
  double dVar16;
  double dVar17;
  
  uVar13 = (ulong)(uint)n;
  iVar15 = *ip;
  if (iVar15 * 8 < n) {
    iVar15 = n >> 3;
    makewt(iVar15,ip,w);
  }
  nc = ip[1];
  if (nc * 2 < n) {
    nc = n >> 1;
    makect(nc,ip,w + iVar15);
  }
  if (2 < n) {
    uVar7 = (uint)n >> 1;
    uVar8 = (ulong)uVar7;
    uVar14 = (ulong)((uint)n >> 2);
    lVar4 = uVar13 - uVar8;
    uVar9 = 1;
    uVar6 = uVar8;
    uVar10 = uVar13;
    while( true ) {
      uVar10 = uVar10 - 1;
      uVar6 = uVar6 - 1;
      lVar4 = lVar4 + 1;
      if (uVar14 <= uVar9) break;
      dVar16 = a[uVar9] - a[uVar10];
      dVar1 = a[uVar6];
      dVar2 = a[lVar4];
      dVar17 = dVar1 - dVar2;
      a[uVar9] = a[uVar9] + a[uVar10];
      a[uVar6] = dVar1 + dVar2;
      t[uVar9] = dVar16 + dVar17;
      t[uVar6] = dVar16 - dVar17;
      uVar9 = uVar9 + 1;
    }
    iVar3 = n - ((uint)n >> 2);
    *t = a[uVar14] - a[iVar3];
    a[uVar14] = a[iVar3] + a[uVar14];
    *a = a[uVar8];
    c = w + iVar15;
    dstsub(uVar7,a,nc,c);
    if ((uint)n < 10) {
      if (uVar7 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(uVar7,ip + 2,a);
      cftfsub(uVar7,a,w);
      rftfsub(uVar7,a,nc,c);
    }
    a[uVar13 - 1] = a[1] - *a;
    a[1] = *a + a[1];
    pdVar5 = a + uVar8 * 2 + -3;
    for (; 3 < (long)uVar8; uVar8 = uVar8 - 2) {
      dVar1 = a[uVar8 - 2];
      *pdVar5 = dVar1 - a[uVar8 - 1];
      pdVar5[-2] = -dVar1 - a[uVar8 - 1];
      pdVar5 = pdVar5 + -4;
    }
    iVar15 = 2;
    while( true ) {
      lVar4 = (long)iVar15;
      uVar7 = (uint)uVar14;
      if (uVar7 < 2) break;
      dstsub(uVar7,t,nc,c);
      if (uVar7 < 5) {
        if (uVar7 == 4) {
          cftfsub(4,t,w);
        }
      }
      else {
        bitrv2(uVar7,ip + 2,t);
        cftfsub(uVar7,t,w);
        rftfsub(uVar7,t,nc,c);
      }
      a[n - iVar15] = t[1] - *t;
      a[lVar4] = *t + t[1];
      lVar11 = (long)(iVar15 * 4);
      for (uVar13 = 2; uVar13 < uVar14; uVar13 = uVar13 + 2) {
        a[lVar11 - lVar4] = -t[uVar13] - t[uVar13 + 1];
        (a + lVar4)[lVar11] = t[uVar13] - t[uVar13 + 1];
        lVar11 = lVar11 + iVar15 * 4;
      }
      uVar9 = uVar14 >> 1;
      pdVar5 = t + -1;
      pdVar12 = t + 1;
      for (uVar13 = 1; uVar13 < uVar9; uVar13 = uVar13 + 1) {
        dVar1 = pdVar12[uVar14];
        *pdVar12 = pdVar5[uVar14 * 2] + dVar1;
        pdVar5[uVar14] = pdVar5[uVar14 * 2] - dVar1;
        pdVar12 = pdVar12 + 1;
        pdVar5 = pdVar5 + -1;
      }
      iVar15 = iVar15 * 2;
      *t = t[uVar7 + (int)uVar9];
      uVar14 = uVar9;
    }
    a[lVar4] = *t;
  }
  *a = 0.0;
  return;
}

Assistant:

void dfst(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    if (n > 2) {
        m = n >> 1;
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] + a[n - j];
            xi = a[j] - a[n - j];
            yr = a[k] + a[n - k];
            yi = a[k] - a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi + yi;
            t[k] = xi - yi;
        }
        t[0] = a[mh] - a[n - mh];
        a[mh] += a[n - mh];
        a[0] = a[m];
        dstsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[1] - a[0];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] - a[j + 1];
            a[2 * j - 1] = -a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dstsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[1] - t[0];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = -t[j] - t[j + 1];
                a[k + l] = t[j] - t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 1; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] + t[m + j];
                t[k] = t[m + k] - t[m + j];
            }
            t[0] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
    }
    a[0] = 0;
}